

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20-poly1305.c
# Opt level: O2

void poly1305_feed_chunk(poly1305 *ctx,uchar *chunk,int len)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  bigval c;
  
  bigval_import_le(&c,chunk,len);
  c.w[(int)((long)len / 8)] =
       c.w[(int)((long)len / 8)] | 1L << (((char)len + (char)((long)len / 8) * -8) * '\b' & 0x3fU);
  bigval_add(&c,&c,&ctx->h);
  uVar27 = (ctx->r).w[0];
  uVar33 = (ctx->r).w[1];
  uVar36 = (ctx->r).w[2];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar27;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = c.w[0];
  uVar29 = SUB168(auVar1 * auVar11,8);
  uVar22 = SUB168(auVar1 * auVar11,0);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar33;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = c.w[0];
  uVar30 = SUB168(auVar2 * auVar12,8);
  uVar23 = SUB168(auVar2 * auVar12,0);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar36;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = c.w[0];
  uVar31 = SUB168(auVar3 * auVar13,8);
  uVar24 = SUB168(auVar3 * auVar13,0);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar27;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = c.w[1];
  uVar32 = SUB168(auVar4 * auVar14,8);
  uVar25 = SUB168(auVar4 * auVar14,0);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar33;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = c.w[1];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar36;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = c.w[1];
  uVar26 = SUB168(auVar6 * auVar16,0);
  uVar28 = uVar23 + uVar29;
  uVar23 = (ulong)CARRY8(uVar23,uVar29);
  uVar29 = uVar24 + uVar30;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar29 + uVar23;
  uVar23 = (ulong)(CARRY8(uVar24,uVar30) || CARRY8(uVar29,uVar23));
  uVar29 = uVar26 + uVar31;
  uVar35 = uVar29 + uVar23;
  auVar20 = auVar5 * auVar15 + auVar20;
  uVar30 = auVar20._0_8_;
  uVar24 = uVar30 + uVar32;
  uVar34 = uVar24 + CARRY8(uVar28,uVar25);
  uVar30 = auVar20._8_8_ +
           (ulong)(CARRY8(uVar30,uVar32) || CARRY8(uVar24,(ulong)CARRY8(uVar28,uVar25)));
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar27;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = c.w[2];
  uVar24 = SUB168(auVar7 * auVar17,8);
  uVar27 = SUB168(auVar7 * auVar17,0);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar33;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = c.w[2];
  auVar21._8_8_ =
       uVar36 * c.w[2] +
       SUB168(auVar6 * auVar16,8) + (ulong)(CARRY8(uVar26,uVar31) || CARRY8(uVar29,uVar23)) +
       (ulong)CARRY8(uVar30,uVar35);
  auVar21._0_8_ = uVar30 + uVar35;
  auVar21 = auVar8 * auVar18 + auVar21;
  uVar36 = auVar21._0_8_;
  uVar23 = uVar27 + uVar34;
  uVar27 = (ulong)CARRY8(uVar27,uVar34);
  uVar33 = uVar36 + uVar24;
  uVar29 = uVar33 + uVar27;
  uVar33 = auVar21._8_8_ + (ulong)(CARRY8(uVar36,uVar24) || CARRY8(uVar33,uVar27));
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar23 >> 2 | uVar29 << 0x3e;
  uVar36 = SUB168(auVar9 * ZEXT816(5),0);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar29 >> 2 | uVar33 << 0x3e;
  auVar19._8_8_ = (ulong)((uint)(uVar33 >> 2) & 3) * 5 + (ulong)((uint)uVar23 & 3);
  auVar19._0_8_ = SUB168(auVar9 * ZEXT816(5),8);
  auVar19 = auVar10 * ZEXT816(5) + auVar19;
  uVar23 = auVar19._0_8_;
  uVar27 = uVar28 + uVar25 + (ulong)CARRY8(uVar36,uVar22) + uVar23;
  uVar29 = (uVar33 >> 4) * 0x19;
  uVar33 = (ulong)CARRY8(uVar29,uVar36 + uVar22);
  (ctx->h).w[0] = uVar29 + uVar36 + uVar22;
  (ctx->h).w[1] = uVar27 + uVar33;
  (ctx->h).w[2] =
       (ulong)(CARRY8(uVar28 + uVar25,uVar23) ||
              CARRY8(uVar28 + uVar25 + uVar23,(ulong)CARRY8(uVar36,uVar22))) + auVar19._8_8_ +
       (ulong)CARRY8(uVar27,uVar33);
  return;
}

Assistant:

static void poly1305_feed_chunk(struct poly1305 *ctx,
                                const unsigned char *chunk, int len)
{
    bigval c;
    bigval_import_le(&c, chunk, len);
    c.w[len / BIGNUM_INT_BYTES] |=
        (BignumInt)1 << (8 * (len % BIGNUM_INT_BYTES));
    bigval_add(&c, &c, &ctx->h);
    bigval_mul_mod_p(&ctx->h, &c, &ctx->r);
}